

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86logging.cpp
# Opt level: O3

Error asmjit::X86Logging_formatImmShuf(StringBuilder *sb,uint32_t u8,uint32_t bits,uint32_t count)

{
  Error EVar1;
  uint32_t uVar2;
  
  EVar1 = StringBuilder::_opChar(sb,1,'<');
  if (EVar1 != 0) {
    return EVar1;
  }
  if (count != 0) {
    uVar2 = 0;
    do {
      if ((uVar2 != 0) && (EVar1 = StringBuilder::_opChar(sb,1,'|'), EVar1 != 0)) {
        return EVar1;
      }
      EVar1 = StringBuilder::_opNumber(sb,1,(ulong)(u8 & ~(-1 << (bits & 0x1f))),0,0,0);
      if (EVar1 != 0) {
        return EVar1;
      }
      uVar2 = uVar2 + 1;
      u8 = u8 >> (bits & 0x1f);
    } while (count != uVar2);
  }
  EVar1 = StringBuilder::_opChar(sb,1,'>');
  return EVar1;
}

Assistant:

ASMJIT_FAVOR_SIZE static Error X86Logging_formatImmShuf(StringBuilder& sb, uint32_t u8, uint32_t bits, uint32_t count) noexcept {
  ASMJIT_PROPAGATE(sb.appendChar('<'));
  uint32_t mask = (1 << bits) - 1;

  for (uint32_t i = 0; i < count; i++, u8 >>= bits) {
    uint32_t value = u8 & mask;
    if (i != 0)
      ASMJIT_PROPAGATE(sb.appendChar('|'));
    ASMJIT_PROPAGATE(sb.appendUInt(value));
  }

  return sb.appendChar('>');
}